

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::BitsToFloatCase::getInputValues
          (BitsToFloatCase *this,int numValues,void **values)

{
  void *pvVar1;
  deUint32 dVar2;
  int iVar3;
  ulong uVar4;
  float fVar5;
  Random rnd;
  deRandom dStack_38;
  
  dVar2 = deStringHash((this->super_CommonFunctionCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&dStack_38,dVar2 ^ 0xbbb225);
  iVar3 = glu::getDataTypeScalarSize
                    ((((this->super_CommonFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  if (0 < iVar3 * numValues) {
    pvVar1 = *values;
    uVar4 = 0;
    do {
      fVar5 = deRandom_getFloat(&dStack_38);
      *(float *)((long)pvVar1 + uVar4 * 4) = fVar5 * 2e+08 + -1e+08;
      uVar4 = uVar4 + 1;
    } while ((uint)(iVar3 * numValues) != uVar4);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0xbbb225u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		const Vec2				range		(-1e8f, +1e8f);

		// \note Filled as floats.
		fillRandomScalars(rnd, range.x(), range.y(), values[0], numValues*scalarSize);
	}